

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::
CreateLoadConstInstrForType<long,IR::Int64ConstOpnd,IRBuilderAsmJs::BuildConstantLoads()::__1>
          (IRBuilderAsmJs *this,long table,RegSlot *regAllocated,uint32 constCount,uint byteOffset,
          IRType irType,anon_union_2_4_ea848c7b_for_ValueType_13 valueType,OpCode opcode)

{
  int64 value;
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  uint32 uVar4;
  JITTimeFunctionBody *pJVar5;
  undefined4 *puVar6;
  void *pvVar7;
  void *pvVar8;
  RegOpnd *this_00;
  Int64ConstOpnd *src1Opnd;
  Instr *instr_00;
  Instr *instr;
  RegOpnd *dstOpnd;
  long constVal;
  uint32 reg;
  uint32 i;
  long *typedTable;
  IRType irType_local;
  uint32 byteOffset_local;
  uint32 constCount_local;
  RegSlot *regAllocated_local;
  byte *table_local;
  IRBuilderAsmJs *this_local;
  ValueType valueType_local;
  
  this_local._6_2_ = valueType;
  _reg = (int64 *)(table + (ulong)byteOffset);
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetConstCount(pJVar5);
  uVar4 = UInt32Math::Mul<8u>(RVar3);
  if (uVar4 <= byteOffset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x314,
                       "(byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()))"
                       ,
                       "byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount())"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar4 = UInt32Math::Mul<8u>(constCount);
  pvVar7 = (void *)AllocSizeMath::Add((size_t)_reg,(ulong)uVar4);
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  pvVar8 = JITTimeFunctionBody::GetConstTable(pJVar5);
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetConstCount(pJVar5);
  if ((void *)((long)pvVar8 + (ulong)RVar3 * 8) < pvVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x315,
                       "(AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount()))"
                       ,
                       "AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount())"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  *regAllocated = *regAllocated + 1;
  constVal._4_4_ = 1;
  do {
    _reg = _reg + 1;
    if (constCount <= constVal._4_4_) {
      return;
    }
    RVar3 = *regAllocated;
    *regAllocated = RVar3 + 1;
    value = *_reg;
    this_00 = BuildDstOpnd(this,RVar3,irType);
    bVar2 = RegIsConstant(this,RVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,799,"(RegIsConstant(reg))","RegIsConstant(reg)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    StackSym::SetIsFromByteCodeConstantTable(this_00->m_sym);
    IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)this_local._6_2_);
    src1Opnd = IR::Int64ConstOpnd::New(value,irType,this->m_func);
    instr_00 = IR::Instr::New(opcode,&this_00->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    BuildConstantLoads::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&this_local + 5),instr_00,value);
    AddInstr(this,instr_00,0xffffffff);
    constVal._4_4_ = constVal._4_4_ + 1;
  } while( true );
}

Assistant:

void IRBuilderAsmJs::CreateLoadConstInstrForType(
    byte* table,
    Js::RegSlot& regAllocated,
    uint32 constCount,
    uint32 byteOffset,
    IRType irType,
    ValueType valueType,
    Js::OpCode opcode,
    F extraProcess
)
{
    T* typedTable = (T*)(table + byteOffset);
    AssertOrFailFast(byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()));
    AssertOrFailFast(AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount()));
    // 1 for return register
    ++regAllocated;
    ++typedTable;

    for (uint32 i = 1; i < constCount; ++i)
    {
        uint32 reg = regAllocated++;
        T constVal = *typedTable++;
        IR::RegOpnd * dstOpnd = BuildDstOpnd(reg, irType);
        Assert(RegIsConstant(reg));
        dstOpnd->m_sym->SetIsFromByteCodeConstantTable();
        dstOpnd->SetValueType(valueType);

        IR::Instr *instr = IR::Instr::New(opcode, dstOpnd, ConstOpnd::New(constVal, irType, m_func), m_func);

        extraProcess(instr, constVal);
        AddInstr(instr, Js::Constants::NoByteCodeOffset);
    }
}